

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PauliX.hpp
# Opt level: O3

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::PauliX<std::complex<float>_>::matrix(PauliX<std::complex<float>_> *this)

{
  undefined8 *puVar1;
  data_type extraout_RDX;
  SquareMatrix<std::complex<float>_> SVar2;
  
  (this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)0x2;
  puVar1 = (undefined8 *)operator_new__(0x20);
  *(undefined8 **)&(this->super_QGate1<std::complex<float>_>).qubit_ = puVar1;
  *puVar1 = 0;
  puVar1[1] = SUB168(ZEXT416(0x3f800000),0);
  puVar1[2] = SUB168(ZEXT416(0x3f800000),0);
  puVar1[3] = 0;
  SVar2.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar2.size_ = (size_type_conflict)this;
  return SVar2;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( 0 , 1 ,
                                                  1 , 0 ) ;
        }